

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlCatalogPtr xmlNewCatalog(int sgml)

{
  xmlHashTablePtr pxVar1;
  xmlCatalogPtr local_18;
  xmlCatalogPtr catal;
  int sgml_local;
  
  if (sgml == 0) {
    local_18 = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
  }
  else {
    local_18 = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
    if ((local_18 != (xmlCatalogPtr)0x0) && (local_18->sgml == (xmlHashTablePtr)0x0)) {
      pxVar1 = xmlHashCreate(10);
      local_18->sgml = pxVar1;
    }
  }
  return local_18;
}

Assistant:

xmlCatalogPtr
xmlNewCatalog(int sgml) {
    xmlCatalogPtr catal = NULL;

    if (sgml) {
	catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE,
		                    xmlCatalogDefaultPrefer);
        if ((catal != NULL) && (catal->sgml == NULL))
	    catal->sgml = xmlHashCreate(10);
    } else
	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		                    xmlCatalogDefaultPrefer);
    return(catal);
}